

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O1

string * __thiscall
InputSource::readLine_abi_cxx11_
          (string *__return_storage_ptr__,InputSource *this,size_t max_line_length)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)max_line_length);
  read_line(this,__return_storage_ptr__,max_line_length,-1);
  return __return_storage_ptr__;
}

Assistant:

std::string
InputSource::readLine(size_t max_line_length)
{
    return read_line(max_line_length);
}